

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O1

size_t __thiscall ezc3d::ParametersNS::Parameters::groupIdx(Parameters *this,string *groupName)

{
  int iVar1;
  Group *pGVar2;
  string *psVar3;
  invalid_argument *this_00;
  ulong idx;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  bVar4 = (this->_groups).
          super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_groups).
          super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (bVar4) {
    idx = 0;
    pGVar2 = group(this,0);
    psVar3 = GroupNS::Group::name_abi_cxx11_(pGVar2);
    iVar1 = std::__cxx11::string::compare((string *)psVar3);
    if (iVar1 != 0) {
      idx = 0;
      do {
        idx = idx + 1;
        bVar4 = idx < (ulong)(((long)(this->_groups).
                                     super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_groups).
                                     super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             -0x5555555555555555);
        if (!bVar4) goto LAB_0013326b;
        pGVar2 = group(this,idx);
        psVar3 = GroupNS::Group::name_abi_cxx11_(pGVar2);
        iVar1 = std::__cxx11::string::compare((string *)psVar3);
      } while (iVar1 != 0);
    }
    if (bVar4) {
      return idx;
    }
  }
LAB_0013326b:
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_48,"Parameters::groupIdx could not find ",groupName);
  std::invalid_argument::invalid_argument(this_00,(string *)&bStack_48);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t
ezc3d::ParametersNS::Parameters::groupIdx(const std::string &groupName) const {
  for (size_t i = 0; i < nbGroups(); ++i)
    if (!group(i).name().compare(groupName))
      return i;
  throw std::invalid_argument("Parameters::groupIdx could not find " +
                              groupName);
}